

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters *params)

{
  string local_128;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_108;
  Resources res;
  Environment env;
  
  Environment::Environment(&env,(Context *)this,1);
  DescriptorSet::Resources::Resources(&res,&env,(Parameters *)context);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_108,&env,&res,params);
  local_128.field_2._M_allocated_capacity = (size_type)local_108.m_data.deleter.m_device;
  local_128.field_2._8_8_ = local_108.m_data.deleter.m_pool.m_internal;
  local_128._M_dataplus._M_p = (pointer)local_108.m_data.object.m_internal;
  local_128._M_string_length = (size_type)local_108.m_data.deleter.m_deviceIface;
  local_108.m_data.object.m_internal = 0;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_108.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Ok",(allocator<char> *)&local_108);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  DescriptorSet::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}